

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O3

size_t axl::io::getSockAddrNetMaskBitCount(sockaddr *addr)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  if (addr->sa_family == 10) {
    sVar1 = sl::findZeroBit((size_t *)(addr->sa_data + 6),2,0);
    sVar2 = 0x80;
    bVar3 = sVar1 < 0x80;
  }
  else {
    if (addr->sa_family != 2) {
      return 0;
    }
    sVar1 = sl::findZeroBit((size_t *)(addr->sa_data + 2),1,0);
    bVar3 = sVar1 < 0x20;
    sVar2 = 0x20;
  }
  if (!bVar3) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

size_t
getSockAddrNetMaskBitCount(const sockaddr* addr) {
	switch (addr->sa_family) {
	case AF_INET:
		return getSockAddrNetMaskBitCount_ip4((const sockaddr_in*)addr);

	case AF_INET6:
		return getSockAddrNetMaskBitCount_ip6((const sockaddr_in6*)addr);

	default:
		return 0;
	}
}